

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperEQ<std::tuple<char_const*>,std::tuple<char_const*>>
          (internal *this,char *expected_expression,char *actual_expression,
          tuple<const_char_*> *expected,tuple<const_char_*> *actual)

{
  AssertionResult AVar2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  if ((expected->super__Tuple_impl<0UL,_const_char_*>).super__Head_base<0UL,_const_char_*,_false>.
      _M_head_impl ==
      (actual->super__Tuple_impl<0UL,_const_char_*>).super__Head_base<0UL,_const_char_*,_false>.
      _M_head_impl) {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  else {
    AVar2 = CmpHelperEQFailure<std::tuple<char_const*>,std::tuple<char_const*>>
                      (this,expected_expression,actual_expression,expected,actual);
    sVar1 = AVar2.message_.ptr_;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
GTEST_DISABLE_MSC_WARNINGS_PUSH_(4389 /* signed/unsigned mismatch */)
  if (expected == actual) {
    return AssertionSuccess();
  }
GTEST_DISABLE_MSC_WARNINGS_POP_()

  return CmpHelperEQFailure(expected_expression, actual_expression, expected,
                            actual);
}